

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BgzfStream_p.cpp
# Opt level: O3

void __thiscall BamTools::Internal::BgzfStream::Seek(BgzfStream *this,int64_t *position)

{
  ulong uVar1;
  int iVar2;
  BamException *this_00;
  int64_t blockAddress;
  stringstream s;
  ulong local_1f0;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  if ((this->m_device == (IBamIODevice *)0x0) ||
     (iVar2 = (*this->m_device->_vptr_IBamIODevice[10])(), (char)iVar2 == '\0')) {
    return;
  }
  uVar1 = *position;
  local_1f0 = uVar1 >> 0x10;
  iVar2 = (*this->m_device->_vptr_IBamIODevice[3])();
  if (((char)iVar2 != '\0') &&
     (iVar2 = (*this->m_device->_vptr_IBamIODevice[6])(this->m_device,&local_1f0,0),
     (char)iVar2 != '\0')) {
    this->m_blockLength = 0;
    this->m_blockAddress = local_1f0;
    this->m_blockOffset = (uint)uVar1 & 0xffff;
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"unable to seek to position: ",0x1c);
  std::ostream::_M_insert<long>((long)local_198);
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"BgzfStream::Seek","");
  std::__cxx11::stringbuf::str();
  BamException::BamException(this_00,&local_1e8,&local_1c8);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BgzfStream::Seek(const int64_t& position)
{

    BT_ASSERT_X(m_device, "BgzfStream::Seek() - trying to seek on null IO device");

    // skip if device is not open
    if (!IsOpen()) {
        return;
    }

    // determine adjusted offset & address
    int blockOffset = (position & 0xFFFF);
    int64_t blockAddress = (position >> 16) & 0xFFFFFFFFFFFFLL;

    // attempt seek in file
    if (m_device->IsRandomAccess() && m_device->Seek(blockAddress)) {

        // update block data & return success
        m_blockLength = 0;
        m_blockAddress = blockAddress;
        m_blockOffset = blockOffset;
    } else {
        std::stringstream s;
        s << "unable to seek to position: " << position;
        throw BamException("BgzfStream::Seek", s.str());
    }
}